

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O2

int get_weapon_skill(CHAR_DATA *ch,int sn)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  
  bVar1 = is_npc(ch);
  if (bVar1) {
    if (sn != -1) {
      if (gsn_hand_to_hand == sn) {
        iVar2 = ch->level * 2 + 0x28;
      }
      else {
        iVar2 = (ch->level * 5) / 2 + 0x28;
      }
      goto LAB_002f7b7d;
    }
  }
  else if (sn != -1) {
    iVar2 = (int)ch->pcdata->learned[sn];
    goto LAB_002f7b7d;
  }
  iVar2 = ch->level * 3;
LAB_002f7b7d:
  iVar3 = 100;
  if (iVar2 < 100) {
    iVar3 = iVar2;
  }
  iVar2 = 0;
  if (0 < iVar3) {
    iVar2 = iVar3;
  }
  return iVar2;
}

Assistant:

int get_weapon_skill(CHAR_DATA *ch, int sn)
{
	int skill;

	/* -1 is exotic */
	if (is_npc(ch))
	{
		if (sn == -1)
			skill = 3 * ch->level;
		else if (sn == gsn_hand_to_hand)
			skill = 40 + 2 * ch->level;
		else
			skill = 40 + 5 * ch->level / 2;
	}
	else
	{
		if (sn == -1)
			skill = 3 * ch->level;
		else
			skill = ch->pcdata->learned[sn];
	}

	return URANGE(0, skill, 100);
}